

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_Interval::ClampedParameterAt(ON_Interval *this,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ON_DBL_QNAN;
  if ((((ABS(x) < 1.23432101234321e+308) &&
       (dVar1 = this->m_t[0], ABS(dVar1) < 1.23432101234321e+308)) &&
      (dVar2 = this->m_t[1], ABS(dVar2) < 1.23432101234321e+308)) && (dVar3 = dVar1, 0.0 < x)) {
    if (1.0 <= x) {
      return dVar2;
    }
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      return (1.0 - x) * dVar1 + dVar2 * x;
    }
  }
  return dVar3;
}

Assistant:

double ON_Interval::ClampedParameterAt(
  double x
) const
{
  if (ON_IS_VALID(x) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]))
  {

    if (x <= 0.0)
      return m_t[0];
    if (x >= 1.0)
      return m_t[1];
    if (m_t[0] == m_t[1])
      return m_t[0]; // no fuzz from a linear combination
    return ((1.0 - x) * m_t[0] + x * m_t[1]);
  }

  return ON_DBL_QNAN;
}